

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O0

void assertEquals<int,int>(int t1,int t2)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  int local_10;
  int local_c;
  int t2_local;
  int t1_local;
  
  if (t1 != t2) {
    local_10 = t2;
    local_c = t1;
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Assertion failed: ");
    poVar1 = std::operator<<(local_188,"Expected:");
    std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(local_188,", Got:");
    std::ostream::operator<<(poVar1,local_10);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_1c8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void assertEquals(T1 t1, T2 t2)
{
	if(!(t1 == t2))
	{
		std::stringstream ss;
		ss << "Assertion failed: ";
		ss << "Expected:" << t1;
		ss << ", Got:" << t2;
		throw std::runtime_error(ss.str());
	}
}